

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  __int32_t _Var1;
  char *pcVar2;
  __int32_t **pp_Var3;
  xmlCharEncodingHandlerPtr handler;
  long lVar4;
  char upper [500];
  
  pcVar2 = xmlGetEncodingAlias(name);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = name;
  }
  if (pcVar2 == (char *)0x0) {
    xmlEncodingErr(XML_I18N_NO_NAME,"xmlNewCharEncodingHandler : no name !\n",(char *)0x0);
  }
  else {
    for (lVar4 = 0; lVar4 != 499; lVar4 = lVar4 + 1) {
      pp_Var3 = __ctype_toupper_loc();
      _Var1 = (*pp_Var3)[pcVar2[lVar4]];
      upper[lVar4] = (char)_Var1;
      if ((char)_Var1 == '\0') break;
    }
    upper[lVar4] = '\0';
    pcVar2 = (*xmlMemStrdup)(upper);
    if (pcVar2 != (char *)0x0) {
      handler = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x28);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        handler->input = input;
        handler->output = output;
        handler->name = pcVar2;
        handler->iconv_in = (iconv_t)0x0;
        handler->iconv_out = (iconv_t)0x0;
        xmlRegisterCharEncodingHandler(handler);
        return handler;
      }
      (*xmlFree)(pcVar2);
    }
    xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL) {
        xmlEncodingErr(XML_I18N_NO_NAME,
		       "xmlNewCharEncodingHandler : no name !\n", NULL);
	return(NULL);
    }
    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL) {
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input = input;
    handler->output = output;
    handler->name = up;

#ifdef LIBXML_ICONV_ENABLED
    handler->iconv_in = NULL;
    handler->iconv_out = NULL;
#endif
#ifdef LIBXML_ICU_ENABLED
    handler->uconv_in = NULL;
    handler->uconv_out = NULL;
#endif

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "Registered encoding handler for %s\n", name);
#endif
    return(handler);
}